

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

bool __thiscall ON_BoundingBox::Transform(ON_BoundingBox *this,ON_Xform *xform)

{
  bool bVar1;
  ON_3dPoint *points;
  ON_3dPointArray corners;
  
  ON_3dPointArray::ON_3dPointArray(&corners);
  bVar1 = GetCorners(this,&corners);
  if (bVar1) {
    bVar1 = ON_3dPointArray::Transform(&corners,xform);
    if (bVar1) {
      points = (ON_3dPoint *)0x0;
      if (0 < corners.super_ON_SimpleArray<ON_3dPoint>.m_count) {
        points = corners.super_ON_SimpleArray<ON_3dPoint>.m_a;
      }
      bVar1 = ON_GetPointListBoundingBox
                        (3,false,corners.super_ON_SimpleArray<ON_3dPoint>.m_count,3,&points->x,this,
                         0,(ON_Xform *)0x0);
    }
  }
  ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&corners.super_ON_SimpleArray<ON_3dPoint>);
  return bVar1;
}

Assistant:

bool ON_BoundingBox::Transform( const ON_Xform& xform )
{
  ON_3dPointArray corners;
  bool rc =  GetCorners( corners );
  if (rc) {
    rc = corners.Transform(xform);
    if (rc)
      rc = Set(corners);
  }
  return rc;
}